

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_go_struct_writer
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result,
          bool uses_countsetfields)

{
  int *piVar1;
  t_field *tfield;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  pointer pptVar4;
  t_go_generator *this_00;
  int iVar5;
  string field_method_prefix;
  string field_name;
  string escape_field_name;
  string name;
  string local_128;
  t_struct *local_108;
  e_req local_fc;
  string local_f8;
  string local_d8;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70 [32];
  string local_50;
  
  local_108 = tstruct;
  local_b8 = tstruct_name;
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string(local_70,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  poVar3 = std::operator<<(poVar3,"func (p *");
  poVar3 = std::operator<<(poVar3,(string *)local_b8);
  poVar3 = std::operator<<(poVar3,") ");
  poVar3 = std::operator<<(poVar3,(string *)&this->write_method_name_);
  poVar3 = std::operator<<(poVar3,"(ctx context.Context, oprot thrift.TProtocol) error {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if ((uses_countsetfields & local_108->is_union_) == 1) {
    iVar2 = (*(local_108->super_t_type).super_t_doc._vptr_t_doc[3])();
    publicize(&local_f8,this,(string *)CONCAT44(extraout_var_00,iVar2),false);
    t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,"if c := p.CountSetFields");
    poVar3 = std::operator<<(poVar3,(string *)&local_f8);
    poVar3 = std::operator<<(poVar3,"(); c != 1 {");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_128);
    poVar3 = std::operator<<(poVar3,
                             "  return fmt.Errorf(\"%T write union: exactly one field must be set (%d set).\", p, c)"
                            );
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  t_generator::indent_abi_cxx11_(&local_f8,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_f8);
  poVar3 = std::operator<<(poVar3,"if err := oprot.WriteStructBegin(ctx, \"");
  poVar3 = std::operator<<(poVar3,local_70);
  poVar3 = std::operator<<(poVar3,"\"); err != nil {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f8);
  t_generator::indent_abi_cxx11_(&local_f8,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_f8);
  poVar3 = std::operator<<(poVar3,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T write struct begin error: \", p), err) }"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f8);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"if p != nil {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar4 = (local_108->members_in_id_order_).
                 super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar4 !=
      (local_108->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    std::__cxx11::string::string((string *)&local_128,"writeField",(allocator *)&local_d8);
    std::__cxx11::string::_M_assign((string *)&local_f8);
    (*(this->super_t_generator)._vptr_t_generator[3])(&local_d8,this,&local_f8);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    iVar2 = (*pptVar4)->key_;
    if (iVar2 < 0) {
      std::__cxx11::string::append((char *)&local_128);
      iVar2 = -iVar2;
    }
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"if err := p.");
    poVar3 = std::operator<<(poVar3,(string *)&local_128);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"(ctx, oprot); err != nil { return err }");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_128);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"if err := oprot.WriteFieldStop(ctx); err != nil {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,
                           "  return thrift.PrependError(\"write field stop error: \", err) }");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"if err := oprot.WriteStructEnd(ctx); err != nil {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,
                           "  return thrift.PrependError(\"write struct stop error: \", err) }");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"return nil");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_128);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  for (pptVar4 = (local_108->members_in_id_order_).
                 super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar4 !=
      (local_108->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    std::__cxx11::string::string((string *)&local_128,"writeField",(allocator *)&local_d8);
    iVar2 = (*pptVar4)->key_;
    std::__cxx11::string::_M_assign((string *)&local_f8);
    (*(this->super_t_generator)._vptr_t_generator[3])(&local_d8,this,&local_f8);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    local_fc = (*pptVar4)->req_;
    iVar5 = iVar2;
    if (iVar2 < 0) {
      std::__cxx11::string::append((char *)&local_128);
      iVar5 = -iVar2;
    }
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"func (p *");
    poVar3 = std::operator<<(poVar3,(string *)local_b8);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,(string *)&local_128);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
    poVar3 = std::operator<<(poVar3,"(ctx context.Context, oprot thrift.TProtocol) (err error) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    if (local_fc == T_OPTIONAL) {
      t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_d8);
      poVar3 = std::operator<<(poVar3,"if p.IsSet");
      publicize(&local_90,this,&local_f8,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_90);
      poVar3 = std::operator<<(poVar3,"() {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d8);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
    }
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"if err := oprot.WriteFieldBegin(ctx, \"");
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    this_00 = (t_go_generator *)0x2df5f6;
    poVar3 = std::operator<<(poVar3,"\", ");
    type_to_enum_abi_cxx11_(&local_90,this_00,(*pptVar4)->type_);
    poVar3 = std::operator<<(poVar3,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"); err != nil {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d8);
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,
                             "  return thrift.PrependError(fmt.Sprintf(\"%T write field begin error "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,": \", p), err) }");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    tfield = *pptVar4;
    std::__cxx11::string::string((string *)&local_50,"p.",(allocator *)&local_d8);
    generate_serialize_field(this,out,tfield,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"if err := oprot.WriteFieldEnd(ctx); err != nil {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,
                             "  return thrift.PrependError(fmt.Sprintf(\"%T write field end error ")
    ;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,": \", p), err) }");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    if (local_fc == T_OPTIONAL) {
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
      poVar3 = std::operator<<(out,(string *)&local_d8);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"  return err");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    t_generator::indent_abi_cxx11_(&local_d8,&this->super_t_generator);
    poVar3 = std::operator<<(out,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void t_go_generator::generate_go_struct_writer(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name,
                                               bool is_result,
                                               bool uses_countsetfields) {
  (void)is_result;
  string name(tstruct->get_name());
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  indent(out) << "func (p *" << tstruct_name << ") " << write_method_name_ << "(ctx context.Context, oprot thrift.TProtocol) error {" << endl;
  indent_up();
  if (tstruct->is_union() && uses_countsetfields) {
    std::string tstruct_name(publicize(tstruct->get_name()));
    out << indent() << "if c := p.CountSetFields" << tstruct_name << "(); c != 1 {" << endl
        << indent()
        << "  return fmt.Errorf(\"%T write union: exactly one field must be set (%d set).\", p, c)"
        << endl << indent() << "}" << endl;
  }
  out << indent() << "if err := oprot.WriteStructBegin(ctx, \"" << name << "\"); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T write struct begin error: \", p), err) }" << endl;

  string field_name;
  string escape_field_name;
  // t_const_value* field_default_value;
  t_field::e_req field_required;
  int32_t field_id = -1;

  out << indent() << "if p != nil {" << endl;
  indent_up();

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_method_prefix("writeField");
    field_name = (*f_iter)->get_name();
    escape_field_name = escape_string(field_name);
    field_id = (*f_iter)->get_key();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "if err := p." << field_method_prefix << field_method_suffix
        << "(ctx, oprot); err != nil { return err }" << endl;
  }

  indent_down();
  out << indent() << "}" << endl;

  // Write the struct map
  out << indent() << "if err := oprot.WriteFieldStop(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(\"write field stop error: \", err) }" << endl;
  out << indent() << "if err := oprot.WriteStructEnd(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(\"write struct stop error: \", err) }" << endl;
  out << indent() << "return nil" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_method_prefix("writeField");
    field_id = (*f_iter)->get_key();
    field_name = (*f_iter)->get_name();
    escape_field_name = escape_string(field_name);
    // field_default_value = (*f_iter)->get_value();
    field_required = (*f_iter)->get_req();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "func (p *" << tstruct_name << ") " << field_method_prefix << field_method_suffix
        << "(ctx context.Context, oprot thrift.TProtocol) (err error) {" << endl;
    indent_up();

    if (field_required == t_field::T_OPTIONAL) {
      out << indent() << "if p.IsSet" << publicize(field_name) << "() {" << endl;
      indent_up();
    }

    out << indent() << "if err := oprot.WriteFieldBegin(ctx, \"" << escape_field_name << "\", "
        << type_to_enum((*f_iter)->get_type()) << ", " << field_id << "); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T write field begin error "
        << field_id << ":" << escape_field_name << ": \", p), err) }" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "p.");

    // Write field closer
    out << indent() << "if err := oprot.WriteFieldEnd(ctx); err != nil {" << endl;
    out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T write field end error "
        << field_id << ":" << escape_field_name << ": \", p), err) }" << endl;

    if (field_required == t_field::T_OPTIONAL) {
      indent_down();
      out << indent() << "}" << endl;
    }

    indent_down();
    out << indent() << "  return err" << endl;
    out << indent() << "}" << endl << endl;
  }
}